

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbQueue.cpp
# Opt level: O2

void __thiscall Hpipe::CbQueue::write_some(CbQueue *this,void *data,PT size)

{
  Buffer *pBVar1;
  PT PVar2;
  ulong __n;
  ulong uVar3;
  
  if (size != 0) {
    if (this->beg == (Buffer *)0x0) {
      PVar2 = 0x7e4;
      if (0x7e4 < size) {
        PVar2 = size;
      }
      pBVar1 = Buffer::New(PVar2,(Buffer *)0x0);
      this->beg = pBVar1;
      this->end = pBVar1;
      this->off = 0;
      goto LAB_00141287;
    }
    pBVar1 = this->end;
    __n = pBVar1->size - pBVar1->used;
    uVar3 = size - __n;
    if (size < __n || uVar3 == 0) {
      memcpy(pBVar1->data + pBVar1->used,data,size);
      this->end->used = this->end->used + size;
    }
    else {
      memcpy(pBVar1->data + pBVar1->used,data,__n);
      data = (void *)((long)data + __n);
      pBVar1 = this->end;
      pBVar1->used = pBVar1->size;
      PVar2 = 0x7e4;
      if (0x7e4 < uVar3) {
        PVar2 = uVar3;
      }
      while( true ) {
        pBVar1 = Buffer::New(PVar2,pBVar1);
        this->end = pBVar1;
        size = uVar3;
LAB_00141287:
        if (size <= pBVar1->size) break;
        memcpy(pBVar1->data,data,pBVar1->size);
        pBVar1 = this->end;
        PVar2 = pBVar1->size;
        data = (void *)((long)data + PVar2);
        pBVar1->used = PVar2;
        uVar3 = size - PVar2;
        PVar2 = 0x7e4;
      }
      memcpy(pBVar1->data,data,size);
      this->end->used = size;
    }
  }
  return;
}

Assistant:

void CbQueue::write_some( const void *data, PT size ) {
    if ( not size )
        return;

    if ( beg ) {
        PT room = end->room();
        if ( size <= room ) {
            memcpy( end->data + end->used, data, size );
            end->used += size;
            return;
        }
        // -> size > room, buffer with used that may be != 0
        memcpy( end->data + end->used, data, room ); data = reinterpret_cast<const PI8 *>( data ) + room;
        end->used = end->size;
        size -= room;

        end = Buffer::New( std::max( PT( Buffer::default_size ), size ), end );
    } else {
        beg = Buffer::New( std::max( PT( Buffer::default_size ), size ) );
        end = beg;
        off = 0;
    }

    // -> size != 0, buffers with used == 0
    while ( size > end->size ) {
        memcpy( end->data, data, end->size ); data = reinterpret_cast<const PI8 *>( data ) + end->size;
        end->used = end->size;
        size -= end->size;

        end = Buffer::New( Buffer::default_size, end );
    }

    // -> buffer with used == 0, size < Buffer::size
    memcpy( end->data, data, size );
    end->used = size;
}